

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O0

Result __thiscall MemTable::skipSearch(MemTable *this,LevelIter level,longlong key)

{
  bool bVar1;
  bool bVar2;
  pointer pQVar3;
  NodePosi *ppQVar4;
  _Self *p_Var5;
  undefined8 uVar6;
  Result RVar7;
  list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_> local_50;
  _Self r;
  QuadListNode<SSTableDataEntry> *curr_node;
  longlong key_local;
  MemTable *this_local;
  LevelIter level_local;
  Result result;
  undefined7 extraout_var;
  
  this_local = (MemTable *)level._M_node;
  pQVar3 = std::_List_iterator<QuadList<SSTableDataEntry>_>::operator->
                     ((_List_iterator<QuadList<SSTableDataEntry>_> *)&this_local);
  ppQVar4 = QuadList<SSTableDataEntry>::first(pQVar3);
  r._M_node = (_List_node_base *)(*ppQVar4)->succ;
  memset(&level_local,0,0x10);
LAB_00108d1a:
  while( true ) {
    pQVar3 = std::_List_iterator<QuadList<SSTableDataEntry>_>::operator->
                       ((_List_iterator<QuadList<SSTableDataEntry>_> *)&this_local);
    bVar1 = QuadList<SSTableDataEntry>::valid(pQVar3,(NodePosi)r._M_node);
    bVar2 = false;
    if (bVar1) {
      bVar2 = (long)r._M_node[1]._M_next <= key;
    }
    if (!bVar2) break;
    r._M_node = r._M_node[4]._M_prev;
  }
  result._0_8_ = r._M_node[4]._M_next;
  r._M_node = (_List_node_base *)result._0_8_;
  if (((_List_node_base *)(result._0_8_ + 0x10))->_M_next == (_List_node_base *)key) {
    pQVar3 = std::_List_iterator<QuadList<SSTableDataEntry>_>::operator->
                       ((_List_iterator<QuadList<SSTableDataEntry>_> *)&this_local);
    bVar2 = QuadList<SSTableDataEntry>::valid(pQVar3,(NodePosi)r._M_node);
    if (bVar2) {
      level_local._M_node._0_1_ = 1;
      for (; uVar6 = result._0_8_, *(long *)(result._0_8_ + 0x58) != 0;
          result._0_8_ = *(undefined8 *)(result._0_8_ + 0x58)) {
      }
LAB_00108e53:
      RVar7._1_7_ = SUB87(uVar6,1);
      RVar7.valid = (bool)level_local._M_node._0_1_;
      RVar7.node = (QuadListNode<SSTableDataEntry> *)result._0_8_;
      return RVar7;
    }
  }
  std::__cxx11::list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::
  rbegin(&local_50);
  local_50.
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node.super__List_node_base._M_prev =
       (_List_node_base *)
       std::reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_>::base
                 ((reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_> *)&local_50);
  p_Var5 = std::_List_iterator<QuadList<SSTableDataEntry>_>::operator--
                     ((_List_iterator<QuadList<SSTableDataEntry>_> *)
                      &local_50.
                       super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                       ._M_impl._M_node.super__List_node_base._M_prev);
  local_50.
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node._M_size = (size_t)p_Var5->_M_node;
  uVar6._0_1_ = std::operator==((_Self *)&this_local,
                                (_Self *)&local_50.
                                          super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                                          ._M_impl._M_node._M_size);
  uVar6._1_7_ = extraout_var;
  if (!uVar6._0_1_) {
    std::_List_iterator<QuadList<SSTableDataEntry>_>::operator++
              ((_List_iterator<QuadList<SSTableDataEntry>_> *)&this_local,0);
    if (r._M_node[5]._M_prev == (_List_node_base *)0x0) {
      pQVar3 = std::_List_iterator<QuadList<SSTableDataEntry>_>::operator->
                         ((_List_iterator<QuadList<SSTableDataEntry>_> *)&this_local);
      ppQVar4 = QuadList<SSTableDataEntry>::first(pQVar3);
      r._M_node = (_List_node_base *)(*ppQVar4)->succ;
    }
    else {
      r._M_node = r._M_node[5]._M_prev;
    }
    goto LAB_00108d1a;
  }
  goto LAB_00108e53;
}

Assistant:

auto MemTable::skipSearch(MemTable::LevelIter level, long long key) {
    struct Result {
        bool valid;
        decltype(level->first()->succ) node;
    };
    auto *curr_node = level->first()->succ;
    auto result = Result{false, nullptr};
    while (true) {
        while (level->valid(curr_node) && curr_node->data.key <= key)
            curr_node = curr_node->succ;
        curr_node = curr_node->pred;
        result.node = curr_node;
        if (curr_node->data.key == key && level->valid(curr_node)) {
            result.valid = true;
            while (result.node->below) {
                result.node = result.node->below;
                // If k found, move to the bottom of its tower for better removing.
                // Though it has been marked as deleted, it should be return for further use like put.
                // This loop unable to process curr_node is header or trailer of level.
            }
            /*if (!level->valid(curr_node)) {
                if (curr_node == level->first()) {
                    result.node = qlist.rbegin()->first();
                }
                if (curr_node == level->last()) {
                    result.node = qlist.rbegin()->last();
                }
            }*/
            return result;
        }
        auto r = --qlist.rbegin().base();
        if (level == r) break;
        level++;
        if (curr_node->below) { // header and trailer node of a QuadList has no above or below. Their tower can be formed by qlist.
            curr_node = curr_node->below;
        } else {
            curr_node = level->first()->succ;
        }
    }

    return result;
}